

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-opts.cpp
# Opt level: O2

SlicerOptions *
parseSlicerOptions(SlicerOptions *__return_storage_ptr__,int argc,char **argv,bool requireCrit,
                  bool inputFileRequired)

{
  LLVMDependenceGraphOptions *pLVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pbVar4;
  bool bVar5;
  SubCommand *pSVar6;
  raw_ostream *prVar7;
  undefined7 in_register_00000009;
  AllocationFunction F;
  char *Str;
  undefined7 in_register_00000081;
  pointer opt;
  initializer_list<llvm::cl::OptionEnumValue> IL;
  initializer_list<llvm::cl::OptionEnumValue> IL_00;
  initializer_list<llvm::cl::OptionEnumValue> IL_01;
  initializer_list<llvm::cl::OptionEnumValue> IL_02;
  undefined1 local_1a41 [33];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  undefined1 local_19f0 [8];
  opt<bool,_false,_llvm::cl::parser<bool>_> criteriaAreNextInstr;
  bool local_1968;
  alias cdaInterprocAlias;
  opt<bool,_false,_llvm::cl::parser<bool>_> cutoffDiverging;
  bool local_1820;
  alias cdAlgAlias;
  opt<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>_>
  ddaType;
  opt<dg::LLVMPointerAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>_>
  ptaType;
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>_>
  cdAlgorithm;
  opt<dg::dda::UndefinedFunsBehavior,_false,_llvm::cl::parser<dg::dda::UndefinedFunsBehavior>_>
  undefinedFunsBehavior;
  opt<bool,_false,_llvm::cl::parser<bool>_> interprocCd;
  bool local_d78;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFile;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allocationFuns;
  undefined3 uStack_c3f;
  string asStack_bc0 [3];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryFunction;
  undefined1 auStack_ac8 [120];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  legacySlicingCriteria;
  ushort local_a48;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  slicingCriteria;
  ushort local_950;
  opt<bool,_false,_llvm::cl::parser<bool>_> preserveDbg;
  bool local_7e0;
  opt<bool,_false,_llvm::cl::parser<bool>_> threads;
  bool local_720;
  opt<bool,_false,_llvm::cl::parser<bool>_> forwardSlicing;
  bool local_660;
  opt<bool,_false,_llvm::cl::parser<bool>_> icfgCD;
  undefined1 local_5a0;
  opt<bool,_false,_llvm::cl::parser<bool>_> cdaPerInstr;
  undefined1 local_4e0;
  opt<bool,_false,_llvm::cl::parser<bool>_> removeSlicingCriteria;
  bool local_420;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preservedFuns;
  string asStack_360 [3];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  legacySecondarySlicingCriteria;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputFile;
  opt<unsigned_long,_false,_llvm::cl::parser<unsigned_long>_> ptaFieldSensitivity;
  
  local_1a41._17_4_ = (undefined4)CONCAT71(in_register_00000081,inputFileRequired);
  local_1a41._9_4_ = (int)CONCAT71(in_register_00000009,requireCrit);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_24f51;
  undefinedFunsBehavior._8_8_ = 0x68;
  ptaType._0_8_ = anon_var_dwarf_24f6a;
  ptaType._8_8_ = 8;
  ddaType._0_8_ = (long)"\t" + 1;
  cdAlgorithm._0_8_ = &SlicingOpts;
  local_1a41._1_8_ = argv;
  local_1a41._21_4_ = argc;
  local_1a41._25_8_ = __return_storage_ptr__;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[2],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)&outputFile,
             (char (*) [2])0x140438,(desc *)&undefinedFunsBehavior,(value_desc *)&ptaType,
             (initializer<char[1]> *)&ddaType,(cat *)&cdAlgorithm);
  cdAlgorithm._0_4_ = 1;
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_24f83;
  undefinedFunsBehavior._8_8_ = 0xc;
  ptaType._0_8_ = (long)"\t" + 1;
  ddaType._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<llvm::cl::FormattingFlags,llvm::cl::desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)&inputFile,
             (FormattingFlags *)&cdAlgorithm,(desc *)&undefinedFunsBehavior,
             (initializer<char[1]> *)&ptaType,(cat *)&ddaType);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_24fb5;
  undefinedFunsBehavior._8_8_ = 0x54;
  ptaType._0_8_ = anon_var_dwarf_24fce;
  ptaType._8_8_ = 4;
  ddaType._0_8_ = (long)"\t" + 1;
  cdAlgorithm._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[3],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)
             &slicingCriteria,(char (*) [3])"sc",(desc *)&undefinedFunsBehavior,
             (value_desc *)&ptaType,(initializer<char[1]> *)&ddaType,(cat *)&cdAlgorithm);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_24ff2;
  undefinedFunsBehavior._8_8_ = 0x1fd;
  ptaType._0_8_ = anon_var_dwarf_24fce;
  ptaType._8_8_ = 4;
  ddaType._0_8_ = (long)"\t" + 1;
  cdAlgorithm._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[2],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)
             &legacySlicingCriteria,(char (*) [2])0x13f316,(desc *)&undefinedFunsBehavior,
             (value_desc *)&ptaType,(initializer<char[1]> *)&ddaType,(cat *)&cdAlgorithm);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_25017;
  undefinedFunsBehavior._8_8_ = 0x13c;
  ptaType._0_8_ = anon_var_dwarf_24fce;
  ptaType._8_8_ = 4;
  ddaType._0_8_ = (long)"\t" + 1;
  cdAlgorithm._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[3],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)
             &legacySecondarySlicingCriteria,(char (*) [3])"2c",(desc *)&undefinedFunsBehavior,
             (value_desc *)&ptaType,(initializer<char[1]> *)&ddaType,(cat *)&cdAlgorithm);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_2504a;
  undefinedFunsBehavior._8_8_ = 0xa1;
  cdAlgorithm._0_8_ = cdAlgorithm._0_8_ & 0xffffffffffffff00;
  ddaType._0_8_ = &SlicingOpts;
  ptaType._0_8_ = &cdAlgorithm;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[24],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&removeSlicingCriteria,
             (char (*) [24])"remove-slicing-criteria",(desc *)&undefinedFunsBehavior,
             (initializer<bool> *)&ptaType,(cat *)&ddaType);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_2507c;
  undefinedFunsBehavior._8_8_ = 0x61;
  ptaType._0_8_ = (long)"undefined-funs" + 10;
  ptaType._8_8_ = 4;
  ddaType._0_8_ = (long)"\t" + 1;
  cdAlgorithm._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[20],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<char[1]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)
             &preservedFuns,(char (*) [20])"preserved-functions",(desc *)&undefinedFunsBehavior,
             (value_desc *)&ptaType,(initializer<char[1]> *)&ddaType,(cat *)&cdAlgorithm);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_250ab;
  undefinedFunsBehavior._8_8_ = 0x77;
  cdAlgorithm.super_Option = (Option)0x1;
  ddaType._0_8_ = &SlicingOpts;
  ptaType._0_8_ = &cdAlgorithm;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[13],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&interprocCd,(char (*) [13])0x140042,
             (desc *)&undefinedFunsBehavior,(initializer<bool> *)&ptaType,(cat *)&ddaType);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_250cf;
  undefinedFunsBehavior._8_8_ = 0x4e;
  cdAlgorithm.super_Option = (Option)0x0;
  ddaType._0_8_ = &SlicingOpts;
  ptaType._0_8_ = &cdAlgorithm;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[13],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&cdaPerInstr,(char (*) [13])"cda-per-inst",
             (desc *)&undefinedFunsBehavior,(initializer<bool> *)&ptaType,(cat *)&ddaType);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_250f3;
  undefinedFunsBehavior._8_8_ = 0x7c;
  cdAlgorithm._0_8_ = (ulong)(uint7)cdAlgorithm._1_7_ << 8;
  ddaType._0_8_ = &SlicingOpts;
  ptaType._0_8_ = &cdAlgorithm;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[9],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&icfgCD,(char (*) [9])"cda-icfg",
             (desc *)&undefinedFunsBehavior,(initializer<bool> *)&ptaType,(cat *)&ddaType);
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_25117;
  undefinedFunsBehavior._8_8_ = 0xb6;
  ptaType._0_8_ = anon_var_dwarf_25130;
  ptaType._8_8_ = 1;
  ddaType._0_8_ = &dg::Offset::UNKNOWN;
  cdAlgorithm._0_8_ = &SlicingOpts;
  llvm::cl::opt<unsigned_long,false,llvm::cl::parser<unsigned_long>>::
  opt<char[20],llvm::cl::desc,llvm::cl::value_desc,llvm::cl::initializer<unsigned_long>,llvm::cl::cat>
            ((opt<unsigned_long,false,llvm::cl::parser<unsigned_long>> *)&ptaFieldSensitivity,
             (char (*) [20])"pta-field-sensitive",(desc *)&undefinedFunsBehavior,
             (value_desc *)&ptaType,(initializer<unsigned_long> *)&ddaType,(cat *)&cdAlgorithm);
  ddaType._0_8_ = anon_var_dwarf_25146;
  undefinedFunsBehavior._0_8_ = anon_var_dwarf_2515f;
  undefinedFunsBehavior._8_8_ = 4;
  undefinedFunsBehavior._16_4_ = 0;
  ddaType._8_8_ = 0x28;
  undefinedFunsBehavior._24_8_ = anon_var_dwarf_2516a;
  undefinedFunsBehavior._32_8_ = 0x3c;
  undefinedFunsBehavior._40_8_ = anon_var_dwarf_25183;
  undefinedFunsBehavior._48_8_ = 9;
  undefinedFunsBehavior._56_4_ = 1;
  undefinedFunsBehavior._64_8_ = anon_var_dwarf_2519c;
  undefinedFunsBehavior._72_8_ = 0x34;
  undefinedFunsBehavior._80_8_ = anon_var_dwarf_251b5;
  undefinedFunsBehavior._88_8_ = 8;
  undefinedFunsBehavior._96_4_ = 2;
  undefinedFunsBehavior._104_8_ = anon_var_dwarf_251c0;
  undefinedFunsBehavior._112_8_ = 0x33;
  undefinedFunsBehavior._120_8_ = anon_var_dwarf_251d9;
  undefinedFunsBehavior.super_opt_storage<dg::dda::UndefinedFunsBehavior,_false,_false>.Value =
       WRITE_ARGS|READ_ANY;
  undefinedFunsBehavior.super_opt_storage<dg::dda::UndefinedFunsBehavior,_false,_false>._4_4_ = 0;
  undefinedFunsBehavior.super_opt_storage<dg::dda::UndefinedFunsBehavior,_false,_false>.Default.
  super_OptionValueBase<dg::dda::UndefinedFunsBehavior,_false>.
  super_OptionValueCopy<dg::dda::UndefinedFunsBehavior>.super_GenericOptionValue =
       (GenericOptionValue)0x3;
  undefinedFunsBehavior.super_opt_storage<dg::dda::UndefinedFunsBehavior,_false,_false>.Default.
  super_OptionValueBase<dg::dda::UndefinedFunsBehavior,_false>.
  super_OptionValueCopy<dg::dda::UndefinedFunsBehavior>._1_3_ = 0;
  undefinedFunsBehavior.super_opt_storage<dg::dda::UndefinedFunsBehavior,_false,_false>.Default.
  super_OptionValueBase<dg::dda::UndefinedFunsBehavior,_false>.
  super_OptionValueCopy<dg::dda::UndefinedFunsBehavior>._8_8_ = anon_var_dwarf_251f2;
  undefinedFunsBehavior.Parser.super_generic_parser_base = (generic_parser_base)0x3d;
  undefinedFunsBehavior.Parser._1_7_ = 0;
  undefinedFunsBehavior.Parser._8_8_ = anon_var_dwarf_2520b;
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorImpl<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo>.
  super_SmallVectorTemplateBase<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_false>
  .
  super_SmallVectorTemplateCommon<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_void>
  .super_SmallVectorBase<unsigned_int>.BeginX = (void *)0xa;
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorImpl<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo>.
  super_SmallVectorTemplateBase<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_false>
  .
  super_SmallVectorTemplateCommon<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_void>
  .super_SmallVectorBase<unsigned_int>.Size = 4;
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts._0_8_ = anon_var_dwarf_25224;
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[8] = '6';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[9] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[10] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0xb] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0xc] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0xd] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0xe] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0xf] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts._16_8_ = anon_var_dwarf_2523d;
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x18] = '\t';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x19] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x1a] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x1b] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x1c] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x1d] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x1e] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x1f] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts._40_8_ = anon_var_dwarf_25248;
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x30] = 'A';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x31] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x32] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x33] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x34] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x35] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x36] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x37] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts._56_8_ = anon_var_dwarf_25261;
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x40] = '\a';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x41] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x42] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x43] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x44] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x45] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x46] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x47] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x48] = '\f';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x49] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x4a] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x4b] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts._80_8_ = anon_var_dwarf_2527a;
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x58] = 'C';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x59] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x5a] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x5b] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x5c] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x5d] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x5e] = '\0';
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts[0x5f] = '\0';
  IL._M_len = 7;
  IL._M_array = (iterator)&undefinedFunsBehavior;
  undefinedFunsBehavior.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::dda::UndefinedFunsBehavior>::OptionInfo,_8U>.
  InlineElts._32_4_ = 8;
  llvm::SmallVector<llvm::cl::OptionEnumValue,_4U>::SmallVector
            ((SmallVector<llvm::cl::OptionEnumValue,_4U> *)&ptaType,IL);
  _entryFunction = &SlicingOpts;
  cdAlgorithm._0_8_ = &allocationFuns;
  _allocationFuns = 8;
  llvm::cl::
  opt<dg::dda::UndefinedFunsBehavior,false,llvm::cl::parser<dg::dda::UndefinedFunsBehavior>>::
  opt<char[15],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::dda::UndefinedFunsBehavior>,llvm::cl::cat>
            ((opt<dg::dda::UndefinedFunsBehavior,false,llvm::cl::parser<dg::dda::UndefinedFunsBehavior>>
              *)&undefinedFunsBehavior,(char (*) [15])"undefined-funs",(desc *)&ddaType,
             (ValuesClass *)&ptaType,(initializer<dg::dda::UndefinedFunsBehavior> *)&cdAlgorithm,
             (cat *)&entryFunction);
  llvm::SmallVectorImpl<llvm::cl::OptionEnumValue>::~SmallVectorImpl
            ((SmallVectorImpl<llvm::cl::OptionEnumValue> *)&ptaType);
  ptaType._0_8_ = anon_var_dwarf_252ac;
  ptaType._8_8_ = 0x1e;
  ddaType._0_8_ = anon_var_dwarf_252c5;
  cdAlgorithm._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[6],llvm::cl::desc,llvm::cl::initializer<char[5]>,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)
             &entryFunction,(char (*) [6])"entry",(desc *)&ptaType,(initializer<char[5]> *)&ddaType,
             (cat *)&cdAlgorithm);
  ptaType._0_8_ = anon_var_dwarf_252db;
  ptaType._8_8_ = 0x18;
  _allocationFuns = _allocationFuns & 0xffffff00;
  cdAlgorithm._0_8_ = &SlicingOpts;
  ddaType._0_8_ = &allocationFuns;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[8],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&forwardSlicing,(char (*) [8])"forward",
             (desc *)&ptaType,(initializer<bool> *)&ddaType,(cat *)&cdAlgorithm);
  ptaType._0_8_ = anon_var_dwarf_2530d;
  ptaType._8_8_ = 0x33;
  _allocationFuns = _allocationFuns & 0xffffff00;
  cdAlgorithm._0_8_ = &SlicingOpts;
  ddaType._0_8_ = &allocationFuns;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[17],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&threads,(char (*) [17])"consider-threads",
             (desc *)&ptaType,(initializer<bool> *)&ddaType,(cat *)&cdAlgorithm);
  ptaType._0_8_ = anon_var_dwarf_25323;
  ptaType._8_8_ = 0x2e;
  _allocationFuns = CONCAT31(uStack_c3f,1);
  cdAlgorithm._0_8_ = &SlicingOpts;
  ddaType._0_8_ = &allocationFuns;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[13],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&preserveDbg,(char (*) [13])"preserve-dbg",
             (desc *)&ptaType,(initializer<bool> *)&ddaType,(cat *)&cdAlgorithm);
  ptaType._0_8_ = anon_var_dwarf_25355;
  ptaType._8_8_ = 0xe0;
  ddaType._0_8_ = &SlicingOpts;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[16],llvm::cl::desc,llvm::cl::cat>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)
             &allocationFuns,(char (*) [16])"allocation-funs",(desc *)&ptaType,(cat *)&ddaType);
  ptaType._0_8_ = anon_var_dwarf_253a0;
  ptaType._8_8_ = 2;
  ptaType._16_4_ = 0;
  cdAlgorithm._0_8_ = anon_var_dwarf_25387;
  cdAlgorithm._8_8_ = 0x1f;
  ptaType._24_8_ = anon_var_dwarf_253ab;
  ptaType._32_8_ = 0x1e;
  ptaType._40_8_ = anon_var_dwarf_253b6;
  ptaType._48_8_ = 2;
  ptaType._56_4_ = 1;
  ptaType._64_8_ = anon_var_dwarf_253c1;
  ptaType._72_8_ = 0x12;
  ptaType._80_8_ = anon_var_dwarf_253da;
  ptaType._88_8_ = 3;
  ptaType._96_4_ = 2;
  ptaType._104_8_ = anon_var_dwarf_253e5;
  ptaType._112_8_ = 0x19;
  IL_00._M_len = 3;
  IL_00._M_array = (iterator)&ptaType;
  llvm::SmallVector<llvm::cl::OptionEnumValue,_4U>::SmallVector
            ((SmallVector<llvm::cl::OptionEnumValue,_4U> *)&ddaType,IL_00);
  _cutoffDiverging = (char *)&cdAlgAlias;
  _cdAlgAlias = (OptionCategory *)((ulong)_cdAlgAlias & 0xffffffff00000000);
  _criteriaAreNextInstr = &SlicingOpts;
  llvm::cl::
  opt<dg::LLVMPointerAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>>
  ::
  opt<char[4],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::LLVMPointerAnalysisOptions::AnalysisType>,llvm::cl::cat>
            ((opt<dg::LLVMPointerAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>>
              *)&ptaType,(char (*) [4])"pta",(desc *)&cdAlgorithm,(ValuesClass *)&ddaType,
             (initializer<dg::LLVMPointerAnalysisOptions::AnalysisType> *)&cutoffDiverging,
             (cat *)&criteriaAreNextInstr);
  llvm::SmallVectorImpl<llvm::cl::OptionEnumValue>::~SmallVectorImpl
            ((SmallVectorImpl<llvm::cl::OptionEnumValue> *)&ddaType);
  _cutoffDiverging = "Choose data dependence analysis to use:";
  ddaType._0_8_ = anon_var_dwarf_25422;
  ddaType._8_8_ = 3;
  ddaType._16_4_ = 0;
  ddaType._24_8_ = anon_var_dwarf_2542d;
  ddaType._32_8_ = 0x29;
  IL_01._M_len = 1;
  IL_01._M_array = (iterator)&ddaType;
  llvm::SmallVector<llvm::cl::OptionEnumValue,_4U>::SmallVector
            ((SmallVector<llvm::cl::OptionEnumValue,_4U> *)&cdAlgorithm,IL_01);
  _criteriaAreNextInstr = (OptionCategory *)&cdaInterprocAlias;
  _cdaInterprocAlias = (OptionCategory *)((ulong)_cdaInterprocAlias & 0xffffffff00000000);
  _cdAlgAlias = &SlicingOpts;
  llvm::cl::
  opt<dg::DataDependenceAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>>
  ::
  opt<char[4],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::DataDependenceAnalysisOptions::AnalysisType>,llvm::cl::cat>
            ((opt<dg::DataDependenceAnalysisOptions::AnalysisType,false,llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>>
              *)&ddaType,(char (*) [4])"dda",(desc *)&cutoffDiverging,(ValuesClass *)&cdAlgorithm,
             (initializer<dg::DataDependenceAnalysisOptions::AnalysisType> *)&criteriaAreNextInstr,
             (cat *)&cdAlgAlias);
  llvm::SmallVectorImpl<llvm::cl::OptionEnumValue>::~SmallVectorImpl
            ((SmallVectorImpl<llvm::cl::OptionEnumValue> *)&cdAlgorithm);
  _criteriaAreNextInstr = (OptionCategory *)0x13fc56;
  cdAlgorithm._0_8_ = anon_var_dwarf_2546c;
  cdAlgorithm._8_8_ = 8;
  cdAlgorithm._16_4_ = 0;
  cdAlgorithm._24_8_ = anon_var_dwarf_25478;
  cdAlgorithm._32_8_ = 0x1e;
  cdAlgorithm._40_8_ = anon_var_dwarf_25484;
  cdAlgorithm._48_8_ = 7;
  cdAlgorithm._56_4_ = 0;
  cdAlgorithm._64_8_ = anon_var_dwarf_25490;
  cdAlgorithm._72_8_ = 0x13;
  cdAlgorithm._80_8_ = (long)"dod+ntscd" + 6;
  cdAlgorithm._88_8_ = 3;
  cdAlgorithm._96_4_ = 0;
  cdAlgorithm._104_8_ = anon_var_dwarf_25490;
  cdAlgorithm._112_8_ = 0x13;
  cdAlgorithm._120_8_ = (long)"dod+ntscd" + 4;
  cdAlgorithm.super_opt_storage<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_false>.
  Value = NTSCD;
  cdAlgorithm.super_opt_storage<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_false>.
  _4_4_ = 0;
  cdAlgorithm.super_opt_storage<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_false>.
  Default.super_OptionValueBase<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false>.
  super_OptionValueCopy<dg::ControlDependenceAnalysisOptions::CDAlgorithm>.super_GenericOptionValue
       = (GenericOptionValue)0x5;
  cdAlgorithm.super_opt_storage<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_false>.
  Default.super_OptionValueBase<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false>.
  super_OptionValueCopy<dg::ControlDependenceAnalysisOptions::CDAlgorithm>._1_3_ = 0;
  cdAlgorithm.super_opt_storage<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_false>.
  Default.super_OptionValueBase<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false>.
  super_OptionValueCopy<dg::ControlDependenceAnalysisOptions::CDAlgorithm>._8_8_ =
       anon_var_dwarf_254b4;
  cdAlgorithm.Parser.super_generic_parser_base = (generic_parser_base)0x38;
  cdAlgorithm.Parser._1_7_ = 0;
  cdAlgorithm.Parser._8_8_ = anon_var_dwarf_254ce;
  cdAlgorithm.Parser.Values.
  super_SmallVectorImpl<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo>
  .
  super_SmallVectorTemplateBase<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_false>
  .
  super_SmallVectorTemplateCommon<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_void>
  .super_SmallVectorBase<unsigned_int>.BeginX = (void *)0x6;
  cdAlgorithm.Parser.Values.
  super_SmallVectorImpl<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo>
  .
  super_SmallVectorTemplateBase<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_false>
  .
  super_SmallVectorTemplateCommon<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_void>
  .super_SmallVectorBase<unsigned_int>.Size = 2;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._0_8_ = anon_var_dwarf_254da;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[8] = 'U';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[9] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[10] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xb] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xc] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xd] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xf] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._16_8_ = anon_var_dwarf_254f4;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x18] = '\x0f';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x19] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x1a] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x1b] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x1c] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x1d] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x1e] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x1f] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x20] = '\x03';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x21] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x22] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x23] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._40_8_ = anon_var_dwarf_25500;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x30] = 'y';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x31] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x32] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x33] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x34] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x35] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x36] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x37] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._56_8_ = anon_var_dwarf_2551a;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x40] = '\x14';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x41] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x42] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x43] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x44] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x45] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x46] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x47] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x48] = '\x04';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x49] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x4a] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x4b] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._80_8_ = anon_var_dwarf_25534;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x58] = 'l';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x59] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x5a] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x5b] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x5c] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x5d] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x5e] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x5f] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._96_8_ = anon_var_dwarf_2554e;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x68] = '\f';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x69] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x6a] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x6b] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x6c] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x6d] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x6e] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x6f] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x70] = '\x01';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x71] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x72] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x73] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._120_8_ = anon_var_dwarf_2555a;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x80] = 'P';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x81] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x82] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x83] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x84] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x85] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x86] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x87] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._136_8_ = anon_var_dwarf_25574;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x90] = '\r';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x91] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x92] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x93] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x94] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x95] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x96] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x97] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x98] = '\x06';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x99] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x9a] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x9b] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._160_8_ = anon_var_dwarf_2558e;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xa8] = 'f';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xa9] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xaa] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xab] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xac] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xad] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xae] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xaf] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._176_8_ = anon_var_dwarf_255a8;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xb8] = '\x03';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xb9] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xba] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xbb] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xbc] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xbd] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xbe] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xbf] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xc0] = '\a';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xc1] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xc2] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xc3] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._200_8_ = anon_var_dwarf_255b4;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xd0] = 'B';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xd1] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xd2] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xd3] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xd4] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xd5] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xd6] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xd7] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._216_8_ = anon_var_dwarf_255ce;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe0] = '\t';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe1] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe2] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe3] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe4] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe5] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe6] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe7] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe8] = '\b';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xe9] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xea] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xeb] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._240_8_ = anon_var_dwarf_255da;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xf8] = '\x16';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xf9] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xfa] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xfb] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xfc] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xfd] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xfe] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0xff] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._256_8_ = anon_var_dwarf_255f4;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x108] = '\x03';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x109] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x10a] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x10b] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x10c] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x10d] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x10e] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x10f] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x110] = '\t';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x111] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x112] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x113] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts._280_8_ = anon_var_dwarf_25600;
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x120] = '$';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x121] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x122] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x123] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x124] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x125] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x126] = '\0';
  cdAlgorithm.Parser.Values.
  super_SmallVectorStorage<llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>::OptionInfo,_8U>
  .InlineElts[0x127] = '\0';
  IL_02._M_len = 0xc;
  IL_02._M_array = (iterator)&cdAlgorithm;
  llvm::SmallVector<llvm::cl::OptionEnumValue,_4U>::SmallVector
            ((SmallVector<llvm::cl::OptionEnumValue,_4U> *)&cutoffDiverging,IL_02);
  _cdAlgAlias = (OptionCategory *)&items;
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)items.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  _cdaInterprocAlias = &SlicingOpts;
  llvm::cl::
  opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,false,llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>>
  ::
  opt<char[4],llvm::cl::desc,llvm::cl::ValuesClass,llvm::cl::initializer<dg::ControlDependenceAnalysisOptions::CDAlgorithm>,llvm::cl::cat>
            ((opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,false,llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>>
              *)&cdAlgorithm,(char (*) [4])"cda",(desc *)&criteriaAreNextInstr,
             (ValuesClass *)&cutoffDiverging,
             (initializer<dg::ControlDependenceAnalysisOptions::CDAlgorithm> *)&cdAlgAlias,
             (cat *)&cdaInterprocAlias);
  llvm::SmallVectorImpl<llvm::cl::OptionEnumValue>::~SmallVectorImpl
            ((SmallVectorImpl<llvm::cl::OptionEnumValue> *)&cutoffDiverging);
  _cutoffDiverging =
       "Choose control dependencies algorithm to use(this options is obsolete, it is alias to -cda):"
  ;
  _cdaInterprocAlias = &SlicingOpts;
  _criteriaAreNextInstr = (OptionCategory *)&cdAlgorithm;
  llvm::cl::alias::alias<char[7],llvm::cl::desc,llvm::cl::aliasopt,llvm::cl::cat>
            (&cdAlgAlias,(char (*) [7])"cd-alg",(desc *)&cutoffDiverging,
             (aliasopt *)&criteriaAreNextInstr,(cat *)&cdaInterprocAlias);
  _cutoffDiverging = "Alias to interproc-cd";
  _criteriaAreNextInstr = (OptionCategory *)&interprocCd;
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&SlicingOpts;
  llvm::cl::alias::alias<char[14],llvm::cl::desc,llvm::cl::aliasopt,llvm::cl::cat>
            (&cdaInterprocAlias,(char (*) [14])"cda-interproc",(desc *)&cutoffDiverging,
             (aliasopt *)&criteriaAreNextInstr,(cat *)&items);
  _criteriaAreNextInstr = (OptionCategory *)0x140060;
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_19f0;
  local_19f0[0] = 1;
  local_1a20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&SlicingOpts;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[17],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&cutoffDiverging,
             (char (*) [17])"cutoff-diverging",(desc *)&criteriaAreNextInstr,
             (initializer<bool> *)&items,(cat *)&local_1a20);
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_25698;
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x11b;
  local_1a20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1a41;
  local_1a41[0] = 0;
  local_19f0 = (undefined1  [8])&SlicingOpts;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
  opt<char[24],llvm::cl::desc,llvm::cl::initializer<bool>,llvm::cl::cat>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&criteriaAreNextInstr,
             (char (*) [24])"criteria-are-next-instr",(desc *)&items,
             (initializer<bool> *)&local_1a20,(cat *)local_19f0);
  pSVar6 = llvm::
           ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
           ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                        *)&llvm::cl::TopLevelSubCommand);
  llvm::cl::HideUnrelatedOptions(&SlicingOpts,pSVar6);
  llvm::cl::ParseCommandLineOptions
            (local_1a41._21_4_,(char **)local_1a41._1_8_,(StringRef)ZEXT816(0x13f02b),
             (raw_ostream *)0x0,(char *)0x0,false);
  uVar2 = local_1a41._25_8_;
  if ((local_1a41[9] != '\0') && ((uint)local_a48 + (uint)local_950 == 0)) {
    prVar7 = (raw_ostream *)llvm::errs();
    llvm::raw_ostream::operator<<(prVar7,"No slicing criteria specified (-sc or -c option)\n");
    exit(1);
  }
  SlicerOptions::SlicerOptions((SlicerOptions *)local_1a41._25_8_);
  std::__cxx11::string::_M_assign((string *)(uVar2 + 0x230));
  std::__cxx11::string::_M_assign((string *)(uVar2 + 0x250));
  std::__cxx11::string::_M_assign((string *)(uVar2 + 0x1d0));
  std::__cxx11::string::_M_assign((string *)(uVar2 + 0x1f0));
  std::__cxx11::string::_M_assign((string *)(uVar2 + 0x210));
  splitList(&items,asStack_360,',');
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(uVar2 + 0x1b0),&items);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&items);
  *(bool *)(uVar2 + 0x1c8) = local_420;
  *(bool *)(uVar2 + 0x1c9) = local_660;
  *(bool *)(uVar2 + 0x1ca) = local_1820;
  *(bool *)(uVar2 + 0x1cb) = local_1968;
  local_1a41._1_8_ = auStack_ac8;
  std::__cxx11::string::_M_assign((string *)&((LLVMDependenceGraphOptions *)uVar2)->entryFunction);
  ((LLVMDependenceGraphOptions *)uVar2)->preserveDbg = local_7e0;
  ((LLVMDependenceGraphOptions *)uVar2)->threads = local_720;
  (((LLVMDependenceGraphOptions *)uVar2)->CDAOptions).super_ControlDependenceAnalysisOptions.
  algorithm = cdAlgorithm.
              super_opt_storage<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_false>.
              Value;
  (((LLVMDependenceGraphOptions *)uVar2)->CDAOptions).super_ControlDependenceAnalysisOptions.
  interprocedural = local_d78;
  (((LLVMDependenceGraphOptions *)uVar2)->CDAOptions).super_ControlDependenceAnalysisOptions.
  field_0x3e = local_5a0;
  (((LLVMDependenceGraphOptions *)uVar2)->CDAOptions).super_ControlDependenceAnalysisOptions.
  field_0x3d = local_4e0;
  splitList(&items,asStack_bc0,',');
  pbVar4 = items.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1a41._9_8_ =
       &(((LLVMDependenceGraphOptions *)uVar2)->PTAOptions).super_PointerAnalysisOptions;
  opt = items.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    uVar3 = local_1a41._25_8_;
    if (opt == pbVar4) {
      pLVar1 = (LLVMDependenceGraphOptions *)local_1a41._25_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&items);
      std::__cxx11::string::_M_assign((string *)uVar3);
      (((LLVMDependenceGraphOptions *)uVar3)->PTAOptions).super_PointerAnalysisOptions.
      super_AnalysisOptions.fieldSensitivity.offset =
           ptaFieldSensitivity.super_opt_storage<unsigned_long,_false,_false>.Value;
      (((LLVMDependenceGraphOptions *)uVar3)->PTAOptions).analysisType =
           ptaType.super_opt_storage<dg::LLVMPointerAnalysisOptions::AnalysisType,_false,_false>.
           Value;
      (((LLVMDependenceGraphOptions *)uVar3)->PTAOptions).threads = local_720;
      (((LLVMDependenceGraphOptions *)uVar3)->DDAOptions).threads = local_720;
      std::__cxx11::string::_M_assign((string *)&pLVar1->DDAOptions);
      (((LLVMDependenceGraphOptions *)uVar3)->DDAOptions).super_DataDependenceAnalysisOptions.
      undefinedFunsBehavior =
           undefinedFunsBehavior.super_opt_storage<dg::dda::UndefinedFunsBehavior,_false,_false>.
           Value;
      (((LLVMDependenceGraphOptions *)uVar3)->DDAOptions).super_DataDependenceAnalysisOptions.
      analysisType = ddaType.
                     super_opt_storage<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_false>
                     .Value;
      llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt(&criteriaAreNextInstr);
      llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt(&cutoffDiverging);
      llvm::cl::Option::~Option((Option *)&cdaInterprocAlias);
      llvm::cl::Option::~Option((Option *)&cdAlgAlias);
      llvm::cl::
      opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm,_false,_llvm::cl::parser<dg::ControlDependenceAnalysisOptions::CDAlgorithm>_>
      ::~opt(&cdAlgorithm);
      llvm::cl::
      opt<dg::DataDependenceAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::DataDependenceAnalysisOptions::AnalysisType>_>
      ::~opt(&ddaType);
      llvm::cl::
      opt<dg::LLVMPointerAnalysisOptions::AnalysisType,_false,_llvm::cl::parser<dg::LLVMPointerAnalysisOptions::AnalysisType>_>
      ::~opt(&ptaType);
      llvm::cl::
      opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~opt(&allocationFuns);
      llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt(&preserveDbg);
      llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt(&threads);
      llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt(&forwardSlicing);
      llvm::cl::
      opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~opt(&entryFunction);
      llvm::cl::
      opt<dg::dda::UndefinedFunsBehavior,_false,_llvm::cl::parser<dg::dda::UndefinedFunsBehavior>_>
      ::~opt(&undefinedFunsBehavior);
      llvm::cl::opt<unsigned_long,_false,_llvm::cl::parser<unsigned_long>_>::~opt
                (&ptaFieldSensitivity);
      llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt(&icfgCD);
      llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt(&cdaPerInstr);
      llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt(&interprocCd);
      llvm::cl::
      opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~opt(&preservedFuns);
      llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::~opt(&removeSlicingCriteria);
      llvm::cl::
      opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~opt(&legacySecondarySlicingCriteria);
      llvm::cl::
      opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~opt(&legacySlicingCriteria);
      llvm::cl::
      opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~opt(&slicingCriteria);
      llvm::cl::
      opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~opt(&inputFile);
      llvm::cl::
      opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~opt(&outputFile);
      return (SlicerOptions *)uVar3;
    }
    splitList(&local_1a20,opt,':');
    if ((long)local_1a20.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1a20.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      bVar5 = std::operator==(local_1a20.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1,"malloc");
      F = MALLOC;
      if (!bVar5) {
        bVar5 = std::operator==(local_1a20.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1,"calloc");
        F = CALLOC;
        if (!bVar5) {
          bVar5 = std::operator==(local_1a20.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1,"realloc");
          F = REALLOC;
          if (!bVar5) {
            prVar7 = (raw_ostream *)llvm::errs();
            Str = "ERROR: Invalid type of allocation function: ";
            goto LAB_0012f6cd;
          }
        }
      }
      dg::AnalysisOptions::addAllocationFunction
                ((AnalysisOptions *)local_1a41._9_8_,
                 local_1a20.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,F);
      dg::AnalysisOptions::addAllocationFunction
                (&(((LLVMDependenceGraphOptions *)uVar2)->DDAOptions).
                  super_DataDependenceAnalysisOptions.super_AnalysisOptions,
                 local_1a20.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,F);
    }
    else {
      prVar7 = (raw_ostream *)llvm::errs();
      Str = "ERROR: Invalid allocation function: ";
LAB_0012f6cd:
      prVar7 = llvm::raw_ostream::operator<<(prVar7,Str);
      prVar7 = llvm::raw_ostream::operator<<(prVar7,opt);
      llvm::raw_ostream::operator<<(prVar7,"\n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a20);
    opt = opt + 1;
  } while( true );
}

Assistant:

SlicerOptions parseSlicerOptions(int argc, char *argv[], bool requireCrit,
                                 bool inputFileRequired) {
    llvm::cl::opt<std::string> outputFile(
            "o",
            llvm::cl::desc(
                    "Save the output to given file. If not specified,\n"
                    "a .sliced suffix is used with the original module name."),
            llvm::cl::value_desc("filename"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> inputFile(
            llvm::cl::Positional, llvm::cl::desc("<input file>"),
            llvm::cl::init(""), llvm::cl::cat(SlicingOpts));

    if (inputFileRequired) {
        inputFile.setNumOccurrencesFlag(llvm::cl::Required);
    }

    llvm::cl::opt<std::string> slicingCriteria(
            "sc",
            llvm::cl::desc(
                    "Slicing criterion\n"
                    "S ::= file1,file2#line1,line2#[var1,fun1],[var2,fun2]\n"
                    "S[&S];S[&S]\n"),
            llvm::cl::value_desc("crit"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> legacySlicingCriteria(
            "c",
            llvm::cl::desc(
                    "Slice with respect to the call-sites of a given function\n"
                    "i. e.: '-c foo' or '-c __assert_fail'. Special value is a "
                    "'ret'\n"
                    "in which case the slice is taken with respect to the "
                    "return value\n"
                    "of the main function. Further, you can specify the "
                    "criterion as\n"
                    "l:v where l is the line in the original code and v is the "
                    "variable.\n"
                    "l must be empty when v is a global variable. For local "
                    "variables,\n"
                    "the variable v must be used on the line l.\n"
                    "You can use comma-separated list of more slicing "
                    "criteria,\n"
                    "e.g. -c foo,5:x,:glob\n"),
            llvm::cl::value_desc("crit"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> legacySecondarySlicingCriteria(
            "2c",
            llvm::cl::desc(
                    "Set secondary slicing criterion. The criterion is a call\n"
                    "to a given function. If just a name of the function is\n"
                    "given, it is a 'control' slicing criterion. If there is "
                    "()\n"
                    "appended, it is 'data' slicing criterion. E.g. foo means\n"
                    "control secondary slicing criterion, foo() means data\n"
                    "data secondary slicing criterion.\n"),
            llvm::cl::value_desc("crit"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> removeSlicingCriteria(
            "remove-slicing-criteria",
            llvm::cl::desc(
                    "By default, slicer keeps also slicing criteria\n"
                    "in the sliced program. This switch makes slicer to "
                    "remove\n"
                    "also the criteria (i.e. behave like Weisser's algorithm)"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> preservedFuns(
            "preserved-functions",
            llvm::cl::desc(
                    "Do not slice bodies of the given functions.\n"
                    "The argument is a comma-separated list of functions.\n"),
            llvm::cl::value_desc("funs"), llvm::cl::init(""),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> interprocCd(
            "interproc-cd",
            llvm::cl::desc(
                    "Compute interprocedural dependencies that cover, e.g.,\n"
                    "calls calls to exit() from inside of procedures. Default: "
                    "true.\n"),
            llvm::cl::init(true), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> cdaPerInstr(
            "cda-per-inst",
            llvm::cl::desc("Compute control dependencies per instruction (the "
                           "default\n"
                           "is per basic block)\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> icfgCD(
            "cda-icfg",
            llvm::cl::desc(
                    "Compute control dependencies on interprocedural CFG.\n"
                    "Default: false (interprocedral CD are computed by\n"
                    "a separate analysis.\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<uint64_t> ptaFieldSensitivity(
            "pta-field-sensitive",
            llvm::cl::desc("Make PTA field sensitive/insensitive. The offset "
                           "in a pointer\n"
                           "is cropped to Offset::UNKNOWN when it is greater "
                           "than N bytes.\n"
                           "Default is full field-sensitivity (N = "
                           "Offset::UNKNOWN).\n"),
            llvm::cl::value_desc("N"), llvm::cl::init(dg::Offset::UNKNOWN),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<dg::dda::UndefinedFunsBehavior> undefinedFunsBehavior(
            "undefined-funs",
            llvm::cl::desc("Set the behavior of undefined functions\n"),
            llvm::cl::values(
                    clEnumValN(dg::dda::PURE, "pure",
                               "Assume that undefined functions do not read "
                               "nor write memory"),
                    clEnumValN(dg::dda::WRITE_ANY, "write-any",
                               "Assume that undefined functions may write any "
                               "memory"),
                    clEnumValN(dg::dda::READ_ANY, "read-any",
                               "Assume that undefined functions may read any "
                               "memory"),
                    clEnumValN(dg::dda::READ_ANY | dg::dda::WRITE_ANY, "rw-any",
                               "Assume that undefined functions may read and "
                               "write any memory"),
                    clEnumValN(dg::dda::WRITE_ARGS, "write-args",
                               "Assume that undefined functions may write to "
                               "arguments"),
                    clEnumValN(dg::dda::READ_ARGS, "read-args",
                               "Assume that undefined functions may read from "
                               "arguments (default)"),
                    clEnumValN(dg::dda::WRITE_ARGS | dg::dda::READ_ARGS,
                               "rw-args",
                               "Assume that undefined functions may read or "
                               "write from/to arguments")
#if LLVM_VERSION_MAJOR < 4
                            ,
                    nullptr
#endif
                    ),
            llvm::cl::init(dg::dda::READ_ARGS), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> entryFunction(
            "entry", llvm::cl::desc("Entry function of the program\n"),
            llvm::cl::init("main"), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> forwardSlicing(
            "forward", llvm::cl::desc("Perform forward slicing\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> threads(
            "consider-threads",
            llvm::cl::desc(
                    "Consider threads are in input file (default=false)."),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> preserveDbg(
            "preserve-dbg",
            llvm::cl::desc("Preserve debugging information (default=true)."),
            llvm::cl::init(true), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<std::string> allocationFuns(
            "allocation-funs",
            llvm::cl::desc(
                    "Treat these functions as allocation functions\n"
                    "The argument is a comma-separated list of func:type,\n"
                    "where func is the function and type is one of\n"
                    "malloc, calloc, or realloc.\n"
                    "E.g., myAlloc:malloc will treat myAlloc as malloc.\n"),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<LLVMPointerAnalysisOptions::AnalysisType> ptaType(
            "pta", llvm::cl::desc("Choose pointer analysis to use:"),
            llvm::cl::values(
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::fi,
                               "fi", "Flow-insensitive PTA (default)"),
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::fs,
                               "fs", "Flow-sensitive PTA"),
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::inv,
                               "inv", "PTA with invalidate nodes")
#ifdef HAVE_SVF
                            ,
                    clEnumValN(LLVMPointerAnalysisOptions::AnalysisType::svf,
                               "svf", "Use pointer analysis from SVF project")
#endif
#if LLVM_VERSION_MAJOR < 4
                            ,
                    nullptr
#endif
                    ),
            llvm::cl::init(LLVMPointerAnalysisOptions::AnalysisType::fi),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<LLVMDataDependenceAnalysisOptions::AnalysisType> ddaType(
            "dda", llvm::cl::desc("Choose data dependence analysis to use:"),
            llvm::cl::values(
                    clEnumValN(LLVMDataDependenceAnalysisOptions::AnalysisType::
                                       ssa,
                               "ssa",
                               "MemorySSA DDA (the only option right now)")
#if LLVM_VERSION_MAJOR < 4
                            ,
                    nullptr
#endif
                    ),
            llvm::cl::init(
                    LLVMDataDependenceAnalysisOptions::AnalysisType::ssa),
            llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<dg::ControlDependenceAnalysisOptions::CDAlgorithm>
            cdAlgorithm(
                    "cda",
                    llvm::cl::desc("Choose control dependencies algorithm:"),
                    llvm::cl::values(
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STANDARD,
                                       "standard",
                                       "Ferrante's algorithm (default)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STANDARD,
                                       "classic", "Alias to \"standard\""),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STANDARD,
                                       "scd", "Alias to \"standard\""),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD,
                                       "ntscd",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD2,
                                       "ntscd2",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm (a different "
                                       "implementation)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD_RANGANATH,
                                       "ntscd-ranganath",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm (the fixed "
                                       "version of the original Ranganath et "
                                       "al.'s algorithm)"),
                            clEnumValN(
                                    dg::ControlDependenceAnalysisOptions::
                                            CDAlgorithm::NTSCD_RANGANATH_ORIG,
                                    "ntscd-ranganath-orig",
                                    "Non-termination sensitive control "
                                    "dependencies algorithm (the original "
                                    "(wrong) Ranganath et al.'s algorithm)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::NTSCD_LEGACY,
                                       "ntscd-legacy",
                                       "Non-termination sensitive control "
                                       "dependencies algorithm (legacy "
                                       "implementation)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::DOD_RANGANATH,
                                       "dod-ranganath",
                                       "Decisive order dependencies algorithm "
                                       "by Ranganath et al. - fixed version "
                                       "(standalone - for debugging)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::DOD,
                                       "dod",
                                       "Decisive order dependencies algorithm "
                                       "(standalone - for debugging)"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::DODNTSCD,
                                       "dod+ntscd", "NTSCD and DOD together"),
                            clEnumValN(dg::ControlDependenceAnalysisOptions::
                                               CDAlgorithm::STRONG_CC,
                                       "scc",
                                       "Use strong control closure algorithm")
#if LLVM_VERSION_MAJOR < 4
                                    ,
                            nullptr
#endif
                            ),
                    llvm::cl::init(dg::ControlDependenceAnalysisOptions::
                                           CDAlgorithm::STANDARD),
                    llvm::cl::cat(SlicingOpts));

    llvm::cl::alias cdAlgAlias(
            "cd-alg",
            llvm::cl::desc("Choose control dependencies algorithm to use"
                           "(this options is obsolete, it is alias to -cda):"),
            llvm::cl::aliasopt(cdAlgorithm), llvm::cl::cat(SlicingOpts));

    llvm::cl::alias cdaInterprocAlias(
            "cda-interproc", llvm::cl::desc("Alias to interproc-cd"),
            llvm::cl::aliasopt(interprocCd), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> cutoffDiverging(
            "cutoff-diverging",
            llvm::cl::desc("Cutoff diverging paths. That is, call abort() on "
                           "those paths that may not reach the slicing "
                           "criterion (default=true)."),
            llvm::cl::init(true), llvm::cl::cat(SlicingOpts));

    llvm::cl::opt<bool> criteriaAreNextInstr(
            "criteria-are-next-instr",
            llvm::cl::desc(
                    "Assume that slicing criteria are not the call-sites\n"
                    "of the given function, but the instructions that\n"
                    "follow the call. I.e. the call is used just to mark\n"
                    "the instruction.\n"
                    "E.g. for 'crit' being set as the criterion, slicing "
                    "critera are all instructions that follow any call of "
                    "'crit'.\n"),
            llvm::cl::init(false), llvm::cl::cat(SlicingOpts));

    ////////////////////////////////////
    // ===-- End of the options --=== //
    ////////////////////////////////////

    // hide all options except ours options
    // this method is available since LLVM 3.7
#if ((LLVM_VERSION_MAJOR > 3) ||                                               \
     ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR >= 7)))
    llvm::cl::HideUnrelatedOptions(SlicingOpts);
#endif
    llvm::cl::ParseCommandLineOptions(argc, argv);

    if (requireCrit) {
        if (slicingCriteria.getNumOccurrences() +
                    legacySlicingCriteria.getNumOccurrences() ==
            0) {
            llvm::errs()
                    << "No slicing criteria specified (-sc or -c option)\n";
            std::exit(1);
        }
    }

    /// Fill the structure
    SlicerOptions options;

    options.inputFile = inputFile;
    options.outputFile = outputFile;
    options.slicingCriteria = slicingCriteria;
    options.legacySlicingCriteria = legacySlicingCriteria;
    options.legacySecondarySlicingCriteria = legacySecondarySlicingCriteria;
    options.preservedFunctions = splitList(preservedFuns);
    options.removeSlicingCriteria = removeSlicingCriteria;
    options.forwardSlicing = forwardSlicing;
    options.cutoffDiverging = cutoffDiverging;
    options.criteriaAreNextInstr = criteriaAreNextInstr;

    auto &dgOptions = options.dgOptions;
    auto &PTAOptions = dgOptions.PTAOptions;
    auto &DDAOptions = dgOptions.DDAOptions;
    auto &CDAOptions = dgOptions.CDAOptions;

    dgOptions.entryFunction = entryFunction;
    dgOptions.preserveDbg = preserveDbg;
    dgOptions.threads = threads;

    CDAOptions.algorithm = cdAlgorithm;
    CDAOptions.interprocedural = interprocCd;
    CDAOptions._icfg = icfgCD;
    CDAOptions.setNodePerInstruction(cdaPerInstr);

    addAllocationFuns(dgOptions, allocationFuns);

    PTAOptions.entryFunction = entryFunction;
    PTAOptions.fieldSensitivity = dg::Offset(ptaFieldSensitivity);
    PTAOptions.analysisType = ptaType;
    PTAOptions.threads = threads;

    DDAOptions.threads = threads;
    DDAOptions.entryFunction = entryFunction;
    DDAOptions.undefinedFunsBehavior = undefinedFunsBehavior;
    DDAOptions.analysisType = ddaType;

    return options;
}